

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O0

ssize_t __thiscall
brynet::net::TCPSession::send(TCPSession *this,int __fd,void *__buf,size_t __n,int __flags)

{
  shared_ptr<brynet::net::IOLoopData> *ioLoopData;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  PACKET_PTR *local_28;
  PACKED_SENDED_CALLBACK *callback_local;
  size_t len_local;
  char *buffer_local;
  TCPSession *this_local;
  
  len_local = CONCAT44(in_register_00000034,__fd);
  ioLoopData = (shared_ptr<brynet::net::IOLoopData> *)this->mSocketID;
  local_28 = (PACKET_PTR *)__n;
  callback_local = (PACKED_SENDED_CALLBACK *)__buf;
  buffer_local = (char *)this;
  DataSocket::makePacket_abi_cxx11_((char *)&local_38,len_local);
  IOLoopDataSend((net *)&this->mIoLoopData,ioLoopData,(SESSION_TYPE)&local_38,local_28,
                 (PACKED_SENDED_CALLBACK *)CONCAT44(in_register_00000084,__flags));
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr(&local_38);
  return extraout_RAX;
}

Assistant:

void TCPSession::send(const char* buffer, 
    size_t len, 
    const DataSocket::PACKED_SENDED_CALLBACK& callback) const
{
    IOLoopDataSend(mIoLoopData, mSocketID, DataSocket::makePacket(buffer, len), callback);
}